

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O0

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callLSetup,
              void *mem)

{
  N_Vector x;
  N_Vector delta;
  int jbad;
  int retval;
  void *mem_local;
  int callLSetup_local;
  realtype tol_local;
  N_Vector w_local;
  N_Vector y_local;
  N_Vector y0_local;
  SUNNonlinearSolver NLS_local;
  
  if ((((NLS == (SUNNonlinearSolver)0x0) || (y0 == (N_Vector)0x0)) || (y == (N_Vector)0x0)) ||
     ((w == (N_Vector)0x0 || (mem == (void *)0x0)))) {
    NLS_local._4_4_ = -1;
  }
  else {
    x = *(N_Vector *)((long)NLS->content + 0x20);
    delta._0_4_ = 0;
    mem_local._4_4_ = callLSetup;
    while ((delta._4_4_ = (**NLS->content)(y0,x,mem), delta._4_4_ == 0 &&
           ((mem_local._4_4_ == 0 ||
            (delta._4_4_ = (**(code **)((long)NLS->content + 8))
                                     (y0,x,delta._0_4_,(long)NLS->content + 0x28,mem),
            delta._4_4_ == 0))))) {
      *(undefined4 *)((long)NLS->content + 0x2c) = 0;
      N_VScale(1.0,y0,y);
      do {
        *(long *)((long)NLS->content + 0x38) = *(long *)((long)NLS->content + 0x38) + 1;
        N_VScale(-1.0,x,x);
        delta._4_4_ = (**(code **)((long)NLS->content + 0x10))(y,x,mem);
        if (delta._4_4_ != 0) break;
        N_VLinearSum(1.0,y,1.0,x,y);
        delta._4_4_ = (**(code **)((long)NLS->content + 0x18))(tol,NLS,y,x,w,mem);
        if (delta._4_4_ == 0) {
          *(undefined4 *)((long)NLS->content + 0x28) = 0;
          return 0;
        }
        if (delta._4_4_ != 1) break;
        *(int *)((long)NLS->content + 0x2c) = *(int *)((long)NLS->content + 0x2c) + 1;
        if (*(int *)((long)NLS->content + 0x30) <= *(int *)((long)NLS->content + 0x2c)) {
          delta._4_4_ = 2;
          break;
        }
        delta._4_4_ = (**NLS->content)(y,x,mem);
      } while (delta._4_4_ == 0);
      if (((delta._4_4_ < 1) || (*(int *)((long)NLS->content + 0x28) != 0)) ||
         (*(long *)((long)NLS->content + 8) == 0)) break;
      *(long *)((long)NLS->content + 0x40) = *(long *)((long)NLS->content + 0x40) + 1;
      mem_local._4_4_ = 1;
      delta._0_4_ = 1;
    }
    *(long *)((long)NLS->content + 0x40) = *(long *)((long)NLS->content + 0x40) + 1;
    NLS_local._4_4_ = delta._4_4_;
  }
  return NLS_local._4_4_;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             N_Vector y0, N_Vector y,
                             N_Vector w, realtype tol,
                             booleantype callLSetup, void* mem)
{
  /* local variables */
  int retval;
  booleantype jbad;
  N_Vector delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) ||
       (y0  == NULL) ||
       (y   == NULL) ||
       (w   == NULL) ||
       (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for(;;) {

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(y0, delta, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* if indicated, setup the linear system */
    if (callLSetup) {
      retval = NEWTON_CONTENT(NLS)->LSetup(y0, delta, jbad,
                                           &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_NLS_SUCCESS) break;
    }

    /* initialize counter curiter */
    NEWTON_CONTENT(NLS)->curiter = 0;

    /* load prediction into y */
    N_VScale(ONE, y0, y);

    /* looping point for Newton iteration. Break out on any error. */
    for(;;) {

      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(y, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

      /* update the Newton iterate */
      N_VLinearSum(ONE, y, ONE, delta, y);

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

      /* if successful update Jacobian status and return */
      if (retval == SUN_NLS_SUCCESS) {
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return(SUN_NLS_SUCCESS);
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) break;

      /* not yet converged. Increment curiter and test for max allowed. */
      NEWTON_CONTENT(NLS)->curiter++;
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters) {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(y, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count
       and loop again with a call to lsetup in which jbad is TRUE. Otherwise
       break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) && (NEWTON_CONTENT(NLS)->LSetup)) {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad = SUNTRUE;
      continue;
    } else {
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return(retval);
}